

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O0

void Aig_ManRegManStop(Aig_ManPre_t *p)

{
  Aig_ManPre_t *p_local;
  
  Vec_VecFree((Vec_Vec_t *)p->vMatrix);
  if (p->vParts != (Vec_Ptr_t *)0x0) {
    Vec_VecFree((Vec_Vec_t *)p->vParts);
  }
  Vec_IntFree(p->vRegs);
  Vec_IntFree(p->vUniques);
  Vec_IntFree(p->vFreeVars);
  Vec_FltFree(p->vPartCost);
  if (p->pfUsedRegs != (char *)0x0) {
    free(p->pfUsedRegs);
    p->pfUsedRegs = (char *)0x0;
  }
  if (p->pfPartVars != (char *)0x0) {
    free(p->pfPartVars);
    p->pfPartVars = (char *)0x0;
  }
  if (p != (Aig_ManPre_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Aig_ManRegManStop( Aig_ManPre_t * p )
{
    Vec_VecFree( (Vec_Vec_t *)p->vMatrix );
    if ( p->vParts )
        Vec_VecFree( (Vec_Vec_t *)p->vParts );
    Vec_IntFree( p->vRegs );
    Vec_IntFree( p->vUniques );
    Vec_IntFree( p->vFreeVars );
    Vec_FltFree( p->vPartCost );
    ABC_FREE( p->pfUsedRegs );
    ABC_FREE( p->pfPartVars );
    ABC_FREE( p );
}